

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int matchbracketclass(int c,char *p,char *ec)

{
  int iVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint local_24;
  int sig;
  char *ec_local;
  char *p_local;
  int c_local;
  
  ec_local = p;
  if (p[1] == '^') {
    ec_local = p + 1;
  }
  local_24 = (uint)(p[1] != '^');
  do {
    while( true ) {
      while( true ) {
        pbVar2 = (byte *)(ec_local + 1);
        if (ec <= pbVar2) {
          return (uint)((local_24 != 0 ^ 0xffU) & 1);
        }
        if (*pbVar2 != 0x25) break;
        ec_local = ec_local + 2;
        iVar1 = match_class(c,(uint)(byte)*ec_local);
        if (iVar1 != 0) {
          return local_24;
        }
      }
      if ((ec_local[2] == '-') && (ec_local + 3 < ec)) break;
      ec_local = (char *)pbVar2;
      if ((uint)*pbVar2 == c) {
        return local_24;
      }
    }
    pbVar3 = (byte *)(ec_local + 3);
    pbVar2 = (byte *)(ec_local + 1);
    ec_local = (char *)pbVar3;
  } while ((c < (int)(uint)*pbVar2) || ((int)(uint)*pbVar3 < c));
  return local_24;
}

Assistant:

static int matchbracketclass(int c, const char *p, const char *ec) {
    int sig = 1;
    if (*(p + 1) == '^') {
        sig = 0;
        p++;  /* skip the '^' */
    }
    while (++p < ec) {
        if (*p == L_ESC) {
            p++;
            if (match_class(c, uchar(*p)))
                return sig;
        } else if ((*(p + 1) == '-') && (p + 2 < ec)) {
            p += 2;
            if (uchar(*(p - 2)) <= c && c <= uchar(*p))
                return sig;
        } else if (uchar(*p) == c) return sig;
    }
    return !sig;
}